

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCFGReader.cpp
# Opt level: O1

void __thiscall DCFGReader::readSymbols(DCFGReader *this,int file_id,Addr baseAddr,json *array)

{
  bool bVar1;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *piVar2;
  reference pbVar3;
  reference pvVar4;
  Addr AVar5;
  mapped_type *pmVar6;
  iterator ed;
  iterator it;
  undefined1 local_d0 [16];
  undefined1 local_c0 [8];
  _Rb_tree_node_base local_b8;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_98;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_78;
  iterator local_50;
  
  local_78.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_78.m_object = (pointer)0x0;
  local_78.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_78.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_98.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_98.m_object = (pointer)0x0;
  local_98.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_98.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_b8._M_right = (_Base_ptr)baseAddr;
  if (array->m_type == array) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::begin((iterator *)local_d0,array);
    piVar2 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator++((iterator *)local_d0);
    local_78.m_object = piVar2->m_object;
    local_78.m_it.primitive_iterator.m_it = (piVar2->m_it).primitive_iterator.m_it;
    local_78.m_it.object_iterator._M_node = (piVar2->m_it).object_iterator._M_node;
    local_78.m_it.array_iterator._M_current = (piVar2->m_it).array_iterator._M_current;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end(&local_50,array);
    local_98.m_object = local_50.m_object;
    local_98.m_it.object_iterator._M_node = local_50.m_it.object_iterator._M_node;
    local_98.m_it.array_iterator._M_current = local_50.m_it.array_iterator._M_current;
    local_98.m_it.primitive_iterator.m_it = local_50.m_it.primitive_iterator.m_it;
    bVar1 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator==(&local_78,&local_98);
    if (!bVar1) {
      do {
        pbVar3 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*(&local_78);
        pvVar4 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::at(pbVar3,1);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   pvVar4);
        AVar5 = str2addr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0);
        if ((undefined1 *)CONCAT44(local_d0._4_4_,local_d0._0_4_) != local_c0) {
          operator_delete((undefined1 *)CONCAT44(local_d0._4_4_,local_d0._0_4_));
        }
        local_d0._0_4_ = file_id;
        pbVar3 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*(&local_78);
        pvVar4 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::at(pbVar3,0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_d0 + 8),pvVar4);
        local_b8._M_left._0_4_ = -1;
        local_50.m_object = (pointer)((long)&(local_b8._M_right)->_M_color + AVar5);
        pmVar6 = std::
                 map<unsigned_long,_DCFGReader::Symbol,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_DCFGReader::Symbol>_>_>
                 ::operator[](&this->m_symbols,(key_type *)&local_50);
        pmVar6->file_id = local_d0._0_4_;
        std::__cxx11::string::operator=((string *)&pmVar6->fname,(string *)(local_d0 + 8));
        pmVar6->lineno = (int)local_b8._M_left;
        if ((_Rb_tree_node_base *)local_d0._8_8_ != &local_b8) {
          operator_delete((void *)local_d0._8_8_);
        }
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::operator++(&local_78);
        bVar1 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::operator==(&local_78,&local_98);
      } while (!bVar1);
    }
    return;
  }
  __assert_fail("array.is_array()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                ,0x125,"void DCFGReader::readSymbols(int, Addr, json &)");
}

Assistant:

void DCFGReader::readSymbols(int file_id, Addr baseAddr, json& array) {
	json::iterator it, ed;

	assert(array.is_array());

	for (it = ++(array.begin()), ed = array.end(); it != ed; ++it) {
		Addr addr = str2addr((*it).at(1));
		m_symbols[baseAddr + addr] = (DCFGReader::Symbol) {
			.file_id = file_id,
			.fname = (*it).at(0),
			.lineno = -1
		};
	}
}